

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseInstrList(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  size_t sVar3;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var4;
  bool bVar5;
  TokenType TVar6;
  TokenType TVar7;
  Result RVar8;
  Enum EVar9;
  code *func;
  ExprList *pEVar10;
  TokenTypePair pair;
  iterator pos;
  iterator pos_00;
  _Head_base<0UL,_wabt::Expr_*,_false> local_50;
  ExprList local_48;
  
  local_48.first_ = (Expr *)0x0;
  local_48.last_ = (Expr *)0x0;
  local_48.size_ = 0;
  _Var4._M_head_impl = local_50._M_head_impl;
LAB_0013d61c:
  do {
    local_50._M_head_impl = _Var4._M_head_impl;
    TVar6 = Peek(this,0);
    TVar7 = Peek(this,1);
    pair._M_elems[1] = TVar7;
    pair._M_elems[0] = TVar6;
    bVar5 = anon_unknown_1::IsInstr(pair);
    if (bVar5) {
      RVar8 = ParseInstr(this,&local_48);
      _Var4._M_head_impl = local_50._M_head_impl;
      pEVar1 = local_48.first_;
      sVar3 = local_48.size_;
      if (RVar8.enum_ == Ok) {
        while (local_50._M_head_impl = pEVar1, local_48.size_ = sVar3,
              local_50._M_head_impl != (Expr *)0x0) {
          if (sVar3 == 0) {
LAB_0013d818:
            local_50._M_head_impl = _Var4._M_head_impl;
            __assert_fail("!empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                          ,0x221,
                          "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                         );
          }
          pEVar1 = ((local_50._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_;
          if (local_48.first_ == local_48.last_) {
            local_48.first_ = (Expr *)0x0;
            local_48.last_ = (Expr *)0x0;
            pEVar2 = local_48.last_;
          }
          else {
            pEVar2 = ((local_50._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_;
            pEVar10 = (ExprList *)&pEVar2->super_intrusive_list_base<wabt::Expr>;
            if (pEVar2 == (Expr *)0x0) {
              pEVar10 = &local_48;
            }
            pEVar10->first_ = pEVar1;
            if (pEVar1 != (Expr *)0x0) {
              (pEVar1->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar2;
              pEVar2 = local_48.last_;
            }
          }
          local_48.last_ = pEVar2;
          local_48.size_ = sVar3 - 1;
          ((local_50._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
          ((local_50._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
          pos.node_ = (Expr *)0x0;
          pos.list_ = exprs;
          intrusive_list<wabt::Expr>::insert
                    (exprs,pos,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50
                    );
          if (local_50._M_head_impl != (Expr *)0x0) {
            (*(local_50._M_head_impl)->_vptr_Expr[1])();
          }
          local_50._M_head_impl = (Expr *)0x0;
          _Var4._M_head_impl = local_50._M_head_impl;
          sVar3 = local_48.size_;
        }
        goto LAB_0013d61c;
      }
      func = anon_unknown_1::IsInstr;
    }
    else {
      if (TVar6 != LparAnn) {
        EVar9 = Ok;
        pEVar1 = local_48.first_;
        goto joined_r0x0013d7f3;
      }
      RVar8 = ParseCodeMetadataAnnotation(this,&local_48);
      _Var4._M_head_impl = local_50._M_head_impl;
      pEVar1 = local_48.first_;
      if (RVar8.enum_ == Ok) {
        while (local_50._M_head_impl = pEVar1, local_50._M_head_impl != (Expr *)0x0) {
          if (local_48.size_ == 0) goto LAB_0013d818;
          pEVar1 = ((local_50._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_;
          if (local_48.first_ == local_48.last_) {
            local_48.first_ = (Expr *)0x0;
            local_48.last_ = (Expr *)0x0;
            pEVar2 = local_48.last_;
          }
          else {
            pEVar2 = ((local_50._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_;
            pEVar10 = (ExprList *)&pEVar2->super_intrusive_list_base<wabt::Expr>;
            if (pEVar2 == (Expr *)0x0) {
              pEVar10 = &local_48;
            }
            pEVar10->first_ = pEVar1;
            if (pEVar1 != (Expr *)0x0) {
              (pEVar1->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar2;
              pEVar2 = local_48.last_;
            }
          }
          local_48.last_ = pEVar2;
          local_48.size_ = local_48.size_ - 1;
          ((local_50._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
          ((local_50._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
          pos_00.node_ = (Expr *)0x0;
          pos_00.list_ = exprs;
          intrusive_list<wabt::Expr>::insert
                    (exprs,pos_00,
                     (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50);
          if (local_50._M_head_impl != (Expr *)0x0) {
            (*(local_50._M_head_impl)->_vptr_Expr[1])();
          }
          local_50._M_head_impl = (Expr *)0x0;
          _Var4._M_head_impl = local_50._M_head_impl;
        }
        goto LAB_0013d61c;
      }
      func = anon_unknown_1::IsLparAnn;
    }
    RVar8 = Synchronize(this,func);
    _Var4._M_head_impl = local_50._M_head_impl;
    if (RVar8.enum_ == Error) {
      EVar9 = Error;
      pEVar1 = local_48.first_;
joined_r0x0013d7f3:
      while (pEVar1 != (Expr *)0x0) {
        pEVar2 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
        (*pEVar1->_vptr_Expr[1])();
        pEVar1 = pEVar2;
      }
      return (Result)EVar9;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseInstrList(ExprList* exprs) {
  WABT_TRACE(ParseInstrList);
  ExprList new_exprs;
  while (true) {
    auto pair = PeekPair();
    if (IsInstr(pair)) {
      if (Succeeded(ParseInstr(&new_exprs))) {
        exprs->splice(exprs->end(), new_exprs);
      } else {
        CHECK_RESULT(Synchronize(IsInstr));
      }
    } else if (IsLparAnn(pair)) {
      if (Succeeded(ParseCodeMetadataAnnotation(&new_exprs))) {
        exprs->splice(exprs->end(), new_exprs);
      } else {
        CHECK_RESULT(Synchronize(IsLparAnn));
      }
    } else {
      break;
    }
  }
  return Result::Ok;
}